

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  int iVar6;
  ulong uVar7;
  Geometry *pGVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  undefined4 uVar12;
  undefined1 (*pauVar13) [16];
  RayHit *pRVar14;
  ulong uVar15;
  RTCRayQueryContext *pRVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1249;
  Scene *local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  float fStack_1230;
  float fStack_122c;
  long local_1228;
  RayQueryContext *local_1220;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  long local_1208;
  float fStack_1200;
  float fStack_11fc;
  undefined1 local_11ec [8];
  float fStack_11e4;
  undefined4 uStack_11e0;
  undefined1 auStack_11dc [4];
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  RTCFilterFunctionNArguments local_11a8;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  long local_1160;
  float local_1158;
  float local_1154;
  float local_1150;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 local_1144;
  uint local_1140;
  uint local_113c;
  uint local_1138;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [12];
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  float local_1088 [4];
  float local_1078 [4];
  float local_1068 [4];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar13 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar103 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar36 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar37 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar38 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar5 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar115 = (ray->super_RayK<1>).tfar;
    fVar120 = 0.0;
    if (0.0 <= fVar115) {
      fVar120 = fVar115;
    }
    uVar21 = -(uint)(1e-18 <= ABS(aVar5.x));
    uVar22 = -(uint)(1e-18 <= ABS(aVar5.y));
    uVar26 = -(uint)(1e-18 <= ABS(aVar5.z));
    auVar61 = divps(_DAT_01f7ba10,(undefined1  [16])aVar5);
    fVar97 = (float)(~uVar21 & 0x5d5e0b6b | auVar61._0_4_ & uVar21);
    fVar98 = (float)(~uVar22 & 0x5d5e0b6b | auVar61._4_4_ & uVar22);
    fVar99 = (float)(~uVar26 & 0x5d5e0b6b | auVar61._8_4_ & uVar26);
    fVar104 = fVar97 * 0.99999964;
    fVar111 = fVar98 * 0.99999964;
    fVar113 = fVar99 * 0.99999964;
    fVar97 = fVar97 * 1.0000004;
    fVar98 = fVar98 * 1.0000004;
    fVar99 = fVar99 * 1.0000004;
    fVar115 = 0.0;
    if (0.0 <= fVar38) {
      fVar115 = fVar38;
    }
    uVar18 = (ulong)(fVar104 < 0.0) * 0x10;
    uVar19 = (ulong)(fVar111 < 0.0) << 4 | 0x20;
    uVar20 = (ulong)(fVar113 < 0.0) << 4 | 0x40;
    auVar61._4_4_ = fVar115;
    auVar61._0_4_ = fVar115;
    auVar61._8_4_ = fVar115;
    auVar61._12_4_ = fVar115;
    auVar107._4_4_ = fVar120;
    auVar107._0_4_ = fVar120;
    auVar107._8_4_ = fVar120;
    auVar107._12_4_ = fVar120;
    _local_fe8 = mm_lookupmask_ps._240_8_;
    _uStack_fe0 = mm_lookupmask_ps._248_8_;
    local_ff8 = fVar37;
    fStack_ff4 = fVar37;
    fStack_ff0 = fVar37;
    fStack_fec = fVar37;
    local_1008 = fVar99;
    fStack_1004 = fVar99;
    fStack_1000 = fVar99;
    fStack_ffc = fVar99;
    local_1018 = auVar61;
    local_1028 = fVar113;
    fStack_1024 = fVar113;
    fStack_1020 = fVar113;
    fStack_101c = fVar113;
    local_1038 = fVar103;
    fStack_1034 = fVar103;
    fStack_1030 = fVar103;
    fStack_102c = fVar103;
    local_1048 = fVar36;
    fStack_1044 = fVar36;
    fStack_1040 = fVar36;
    fStack_103c = fVar36;
    local_1058 = fVar104;
    fStack_1054 = fVar104;
    fStack_1050 = fVar104;
    fStack_104c = fVar104;
    local_1118 = fVar111;
    fStack_1114 = fVar111;
    fStack_1110 = fVar111;
    fStack_110c = fVar111;
    local_1128 = fVar97;
    fStack_1124 = fVar97;
    fStack_1120 = fVar97;
    fStack_111c = fVar97;
    local_1178 = fVar98;
    fStack_1174 = fVar98;
    fStack_1170 = fVar98;
    fStack_116c = fVar98;
    local_1248 = (Scene *)ray;
    fVar115 = fVar98;
    fVar120 = fVar98;
    fVar38 = fVar98;
    fVar43 = fVar111;
    fVar44 = fVar111;
    fVar45 = fVar111;
    fVar46 = fVar97;
    fVar47 = fVar97;
    fVar48 = fVar97;
    local_1220 = context;
    fVar92 = fVar104;
    fVar91 = fVar104;
    fVar90 = fVar104;
    fVar89 = fVar36;
    fVar88 = fVar36;
    fVar87 = fVar36;
    fVar86 = fVar103;
    fVar85 = fVar103;
    fVar84 = fVar103;
    fVar83 = fVar113;
    fVar82 = fVar113;
    fVar81 = fVar113;
    fVar80 = fVar99;
    fVar79 = fVar99;
    fVar78 = fVar99;
    fVar77 = fVar37;
    fVar76 = fVar37;
    fVar75 = fVar37;
LAB_00d0353f:
    do {
      pauVar10 = pauVar13 + -1;
      pauVar13 = pauVar13 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar10 + 8) < *pfVar1 || *(float *)((long)*pauVar10 + 8) == *pfVar1) {
        uVar17 = *(ulong *)*pauVar13;
        while ((uVar17 & 8) == 0) {
          pfVar1 = (float *)(uVar17 + 0x20 + uVar18);
          auVar39._0_4_ = (*pfVar1 - fVar84) * fVar90;
          auVar39._4_4_ = (pfVar1[1] - fVar85) * fVar91;
          auVar39._8_4_ = (pfVar1[2] - fVar86) * fVar92;
          auVar39._12_4_ = (pfVar1[3] - fVar103) * fVar104;
          pfVar1 = (float *)(uVar17 + 0x20 + uVar19);
          auVar57._0_4_ = (*pfVar1 - fVar87) * fVar111;
          auVar57._4_4_ = (pfVar1[1] - fVar88) * fVar43;
          auVar57._8_4_ = (pfVar1[2] - fVar89) * fVar44;
          auVar57._12_4_ = (pfVar1[3] - fVar36) * fVar45;
          auVar39 = maxps(auVar39,auVar57);
          pfVar1 = (float *)(uVar17 + 0x20 + uVar20);
          auVar65._0_4_ = (*pfVar1 - fVar75) * fVar81;
          auVar65._4_4_ = (pfVar1[1] - fVar76) * fVar82;
          auVar65._8_4_ = (pfVar1[2] - fVar77) * fVar83;
          auVar65._12_4_ = (pfVar1[3] - fVar37) * fVar113;
          auVar49 = maxps(auVar65,auVar61);
          _local_1108 = maxps(auVar39,auVar49);
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar18 ^ 0x10));
          auVar69._0_4_ = (*pfVar1 - fVar84) * fVar97;
          auVar69._4_4_ = (pfVar1[1] - fVar85) * fVar46;
          auVar69._8_4_ = (pfVar1[2] - fVar86) * fVar47;
          auVar69._12_4_ = (pfVar1[3] - fVar103) * fVar48;
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar19 ^ 0x10));
          auVar74._0_4_ = (*pfVar1 - fVar87) * fVar98;
          auVar74._4_4_ = (pfVar1[1] - fVar88) * fVar115;
          auVar74._8_4_ = (pfVar1[2] - fVar89) * fVar120;
          auVar74._12_4_ = (pfVar1[3] - fVar36) * fVar38;
          auVar39 = minps(auVar69,auVar74);
          pfVar1 = (float *)(uVar17 + 0x20 + (uVar20 ^ 0x10));
          auVar55._0_4_ = (*pfVar1 - fVar75) * fVar78;
          auVar55._4_4_ = (pfVar1[1] - fVar76) * fVar79;
          auVar55._8_4_ = (pfVar1[2] - fVar77) * fVar80;
          auVar55._12_4_ = (pfVar1[3] - fVar37) * fVar99;
          auVar49 = minps(auVar55,auVar107);
          auVar39 = minps(auVar39,auVar49);
          auVar49._4_4_ = -(uint)(local_1108._4_4_ <= auVar39._4_4_);
          auVar49._0_4_ = -(uint)(local_1108._0_4_ <= auVar39._0_4_);
          auVar49._8_4_ = -(uint)(local_1108._8_4_ <= auVar39._8_4_);
          auVar49._12_4_ = -(uint)(local_1108._12_4_ <= auVar39._12_4_);
          uVar21 = movmskps((int)local_1248,auVar49);
          local_1248 = (Scene *)(ulong)uVar21;
          if (uVar21 == 0) {
            if (pauVar13 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d0353f;
          }
          local_1248 = (Scene *)(ulong)(byte)uVar21;
          uVar15 = uVar17 & 0xfffffffffffffff0;
          lVar9 = 0;
          if (local_1248 != (Scene *)0x0) {
            for (; ((byte)uVar21 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar17 = *(ulong *)(uVar15 + lVar9 * 8);
          uVar21 = (uVar21 & 0xff) - 1 & uVar21 & 0xff;
          if (uVar21 != 0) {
            uVar22 = *(uint *)(local_1108 + lVar9 * 4);
            local_1248 = (Scene *)(ulong)uVar22;
            lVar9 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar7 = *(ulong *)(uVar15 + lVar9 * 8);
            uVar26 = *(uint *)(local_1108 + lVar9 * 4);
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              if (uVar22 < uVar26) {
                *(ulong *)*pauVar13 = uVar7;
                *(uint *)((long)*pauVar13 + 8) = uVar26;
                pauVar13 = pauVar13 + 1;
              }
              else {
                *(ulong *)*pauVar13 = uVar17;
                *(uint *)((long)*pauVar13 + 8) = uVar22;
                pauVar13 = pauVar13 + 1;
                uVar17 = uVar7;
              }
            }
            else {
              auVar40._8_4_ = uVar22;
              auVar40._0_8_ = uVar17;
              auVar40._12_4_ = 0;
              auVar50._8_4_ = uVar26;
              auVar50._0_8_ = uVar7;
              auVar50._12_4_ = 0;
              lVar9 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              uVar17 = *(ulong *)(uVar15 + lVar9 * 8);
              iVar11 = *(int *)(local_1108 + lVar9 * 4);
              auVar56._8_4_ = iVar11;
              auVar56._0_8_ = uVar17;
              auVar56._12_4_ = 0;
              auVar62._8_4_ = -(uint)((int)uVar22 < (int)uVar26);
              uVar21 = uVar21 - 1 & uVar21;
              fVar115 = fStack_1174;
              fVar120 = fStack_1170;
              fVar38 = fStack_116c;
              fVar98 = local_1178;
              if (uVar21 == 0) {
                auVar62._4_4_ = auVar62._8_4_;
                auVar62._0_4_ = auVar62._8_4_;
                auVar62._12_4_ = auVar62._8_4_;
                auVar39 = auVar40 & auVar62 | ~auVar62 & auVar50;
                auVar49 = auVar50 & auVar62 | ~auVar62 & auVar40;
                auVar63._8_4_ = -(uint)(auVar39._8_4_ < iVar11);
                auVar63._0_8_ = CONCAT44(auVar63._8_4_,auVar63._8_4_);
                auVar63._12_4_ = auVar63._8_4_;
                auVar57 = auVar56 & auVar63 | ~auVar63 & auVar39;
                auVar41._8_4_ = -(uint)(auVar49._8_4_ < auVar57._8_4_);
                auVar41._4_4_ = auVar41._8_4_;
                auVar41._0_4_ = auVar41._8_4_;
                auVar41._12_4_ = auVar41._8_4_;
                *pauVar13 = ~auVar41 & auVar49 | auVar57 & auVar41;
                pauVar13[1] = auVar49 & auVar41 | ~auVar41 & auVar57;
                pauVar13 = pauVar13 + 2;
                uVar17 = ~auVar63._0_8_ & uVar17 | auVar39._0_8_ & auVar63._0_8_;
                local_1248 = (Scene *)(ulong)uVar21;
              }
              else {
                local_1248 = (Scene *)0x0;
                if ((Scene *)(ulong)uVar21 != (Scene *)0x0) {
                  for (; (uVar21 >> (long)local_1248 & 1) == 0;
                      local_1248 = (Scene *)((long)&(local_1248->super_AccelN).super_Accel.
                                                    super_AccelData.super_RefCount._vptr_RefCount +
                                            1)) {
                  }
                }
                iVar6 = *(int *)(local_1108 + (long)local_1248 * 4);
                auVar68._8_4_ = iVar6;
                auVar68._0_8_ = *(undefined8 *)(uVar15 + (long)local_1248 * 8);
                auVar68._12_4_ = 0;
                auVar64._4_4_ = auVar62._8_4_;
                auVar64._0_4_ = auVar62._8_4_;
                auVar64._8_4_ = auVar62._8_4_;
                auVar64._12_4_ = auVar62._8_4_;
                auVar39 = auVar40 & auVar64 | ~auVar64 & auVar50;
                auVar49 = auVar50 & auVar64 | ~auVar64 & auVar40;
                auVar73._0_4_ = -(uint)(iVar11 < iVar6);
                auVar73._4_4_ = -(uint)(iVar11 < iVar6);
                auVar73._8_4_ = -(uint)(iVar11 < iVar6);
                auVar73._12_4_ = -(uint)(iVar11 < iVar6);
                auVar65 = auVar56 & auVar73 | ~auVar73 & auVar68;
                auVar74 = ~auVar73 & auVar56 | auVar68 & auVar73;
                auVar58._8_4_ = -(uint)(auVar49._8_4_ < auVar74._8_4_);
                auVar58._4_4_ = auVar58._8_4_;
                auVar58._0_4_ = auVar58._8_4_;
                auVar58._12_4_ = auVar58._8_4_;
                auVar69 = auVar49 & auVar58 | ~auVar58 & auVar74;
                auVar51._8_4_ = -(uint)(auVar39._8_4_ < auVar65._8_4_);
                auVar51._0_8_ = CONCAT44(auVar51._8_4_,auVar51._8_4_);
                auVar51._12_4_ = auVar51._8_4_;
                auVar57 = ~auVar51 & auVar39 | auVar65 & auVar51;
                auVar42._8_4_ = -(uint)(auVar57._8_4_ < auVar69._8_4_);
                auVar42._4_4_ = auVar42._8_4_;
                auVar42._0_4_ = auVar42._8_4_;
                auVar42._12_4_ = auVar42._8_4_;
                *pauVar13 = ~auVar58 & auVar49 | auVar74 & auVar58;
                pauVar13[1] = ~auVar42 & auVar57 | auVar69 & auVar42;
                pauVar13[2] = auVar57 & auVar42 | ~auVar42 & auVar69;
                pauVar13 = pauVar13 + 3;
                uVar17 = auVar39._0_8_ & auVar51._0_8_ | ~auVar51._0_8_ & auVar65._0_8_;
                fVar111 = local_1118;
                fVar43 = fStack_1114;
                fVar44 = fStack_1110;
                fVar45 = fStack_110c;
                fVar97 = local_1128;
                fVar46 = fStack_1124;
                fVar47 = fStack_1120;
                fVar48 = fStack_111c;
              }
            }
          }
        }
        local_1160 = (ulong)((uint)uVar17 & 0xf) - 8;
        if (local_1160 != 0) {
          uVar17 = uVar17 & 0xfffffffffffffff0;
          local_1228 = 0;
          do {
            local_1208 = local_1228 * 0xb0;
            fVar115 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar120 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar103 = (ray->super_RayK<1>).org.field_0.m128[2];
            pfVar1 = (float *)(uVar17 + local_1208);
            pfVar2 = (float *)(uVar17 + 0x10 + local_1208);
            pfVar3 = (float *)(uVar17 + 0x20 + local_1208);
            pfVar4 = (float *)(uVar17 + 0x30 + local_1208);
            fVar87 = *pfVar1 - fVar115;
            fVar90 = pfVar1[1] - fVar115;
            fStack_1200 = pfVar1[2] - fVar115;
            fStack_11fc = pfVar1[3] - fVar115;
            local_11d8._0_4_ = *pfVar2 - fVar120;
            local_11d8._4_4_ = pfVar2[1] - fVar120;
            fStack_11d0 = pfVar2[2] - fVar120;
            fStack_11cc = pfVar2[3] - fVar120;
            local_11b8 = *pfVar3 - fVar103;
            fStack_11b4 = pfVar3[1] - fVar103;
            fStack_11b0 = pfVar3[2] - fVar103;
            fStack_11ac = pfVar3[3] - fVar103;
            fVar37 = *pfVar4 - fVar115;
            fVar97 = pfVar4[1] - fVar115;
            fVar43 = pfVar4[2] - fVar115;
            fVar46 = pfVar4[3] - fVar115;
            pfVar1 = (float *)(uVar17 + 0x40 + local_1208);
            fVar38 = *pfVar1 - fVar120;
            fVar99 = pfVar1[1] - fVar120;
            fVar44 = pfVar1[2] - fVar120;
            fVar47 = pfVar1[3] - fVar120;
            pfVar1 = (float *)(uVar17 + 0x50 + local_1208);
            fVar98 = *pfVar1 - fVar103;
            fVar113 = pfVar1[1] - fVar103;
            fVar45 = pfVar1[2] - fVar103;
            fVar48 = pfVar1[3] - fVar103;
            pfVar1 = (float *)(uVar17 + 0x60 + local_1208);
            fVar105 = *pfVar1 - fVar115;
            fVar112 = pfVar1[1] - fVar115;
            fVar114 = pfVar1[2] - fVar115;
            fVar115 = pfVar1[3] - fVar115;
            pfVar1 = (float *)(uVar17 + 0x70 + local_1208);
            fVar116 = *pfVar1 - fVar120;
            fVar118 = pfVar1[1] - fVar120;
            fVar119 = pfVar1[2] - fVar120;
            fVar120 = pfVar1[3] - fVar120;
            pfVar1 = (float *)(uVar17 + 0x80 + local_1208);
            fVar100 = *pfVar1 - fVar103;
            fVar101 = pfVar1[1] - fVar103;
            fVar102 = pfVar1[2] - fVar103;
            fVar103 = pfVar1[3] - fVar103;
            local_11ec._4_4_ = fVar105 - fVar87;
            fStack_11e4 = fVar112 - fVar90;
            uStack_11e0 = fVar114 - fStack_1200;
            auStack_11dc = (undefined1  [4])(fVar115 - fStack_11fc);
            local_f98 = fVar116 - (float)local_11d8._0_4_;
            fStack_f94 = fVar118 - (float)local_11d8._4_4_;
            fStack_f90 = fVar119 - fStack_11d0;
            fStack_f8c = fVar120 - fStack_11cc;
            local_f88 = fVar100 - local_11b8;
            fStack_f84 = fVar101 - fStack_11b4;
            fStack_f80 = fVar102 - fStack_11b0;
            fStack_f7c = fVar103 - fStack_11ac;
            fVar36 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_1230 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1240 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar111 = (local_f98 * (local_11b8 + fVar100) -
                      ((float)local_11d8._0_4_ + fVar116) * local_f88) * fVar36 +
                      ((fVar87 + fVar105) * local_f88 -
                      (local_11b8 + fVar100) * (float)local_11ec._4_4_) * fStack_1230 +
                      ((float)local_11ec._4_4_ * ((float)local_11d8._0_4_ + fVar116) -
                      (fVar87 + fVar105) * local_f98) * fStack_1240;
            fVar104 = (fStack_f94 * (fStack_11b4 + fVar101) -
                      ((float)local_11d8._4_4_ + fVar118) * fStack_f84) * fVar36 +
                      ((fVar90 + fVar112) * fStack_f84 - (fStack_11b4 + fVar101) * fStack_11e4) *
                      fStack_1230 +
                      (fStack_11e4 * ((float)local_11d8._4_4_ + fVar118) -
                      (fVar90 + fVar112) * fStack_f94) * fStack_1240;
            local_fc8._0_8_ = CONCAT44(fVar104,fVar111);
            local_fc8._8_4_ =
                 (fStack_f90 * (fStack_11b0 + fVar102) - (fStack_11d0 + fVar119) * fStack_f80) *
                 fVar36 + ((fStack_1200 + fVar114) * fStack_f80 -
                          (fStack_11b0 + fVar102) * (float)uStack_11e0) * fStack_1230 +
                          ((float)uStack_11e0 * (fStack_11d0 + fVar119) -
                          (fStack_1200 + fVar114) * fStack_f90) * fStack_1240;
            local_fc8._12_4_ =
                 (fStack_f8c * (fStack_11ac + fVar103) - (fStack_11cc + fVar120) * fStack_f7c) *
                 fVar36 + ((fStack_11fc + fVar115) * fStack_f7c -
                          (fStack_11ac + fVar103) * (float)auStack_11dc) * fStack_1230 +
                          ((float)auStack_11dc * (fStack_11cc + fVar120) -
                          (fStack_11fc + fVar115) * fStack_f8c) * fStack_1240;
            fVar88 = fVar87 - fVar37;
            fVar91 = fVar90 - fVar97;
            fVar93 = fStack_1200 - fVar43;
            fVar95 = fStack_11fc - fVar46;
            fVar83 = (float)local_11d8._0_4_ - fVar38;
            fVar84 = (float)local_11d8._4_4_ - fVar99;
            fVar85 = fStack_11d0 - fVar44;
            fVar86 = fStack_11cc - fVar47;
            fVar75 = local_11b8 - fVar98;
            fVar77 = fStack_11b4 - fVar113;
            fVar79 = fStack_11b0 - fVar45;
            fVar81 = fStack_11ac - fVar48;
            local_fb8._0_4_ =
                 (fVar83 * (local_11b8 + fVar98) - ((float)local_11d8._0_4_ + fVar38) * fVar75) *
                 fVar36 + ((fVar87 + fVar37) * fVar75 - (local_11b8 + fVar98) * fVar88) *
                          fStack_1230 +
                          (fVar88 * ((float)local_11d8._0_4_ + fVar38) - (fVar87 + fVar37) * fVar83)
                          * fStack_1240;
            local_fb8._4_4_ =
                 (fVar84 * (fStack_11b4 + fVar113) - ((float)local_11d8._4_4_ + fVar99) * fVar77) *
                 fVar36 + ((fVar90 + fVar97) * fVar77 - (fStack_11b4 + fVar113) * fVar91) *
                          fStack_1230 +
                          (fVar91 * ((float)local_11d8._4_4_ + fVar99) - (fVar90 + fVar97) * fVar84)
                          * fStack_1240;
            local_fb8._8_4_ =
                 (fVar85 * (fStack_11b0 + fVar45) - (fStack_11d0 + fVar44) * fVar79) * fVar36 +
                 ((fStack_1200 + fVar43) * fVar79 - (fStack_11b0 + fVar45) * fVar93) * fStack_1230 +
                 (fVar93 * (fStack_11d0 + fVar44) - (fStack_1200 + fVar43) * fVar85) * fStack_1240;
            local_fb8._12_4_ =
                 (fVar86 * (fStack_11ac + fVar48) - (fStack_11cc + fVar47) * fVar81) * fVar36 +
                 ((fStack_11fc + fVar46) * fVar81 - (fStack_11ac + fVar48) * fVar95) * fStack_1230 +
                 (fVar95 * (fStack_11cc + fVar47) - (fStack_11fc + fVar46) * fVar86) * fStack_1240;
            local_fa8 = fVar37 - fVar105;
            fStack_fa4 = fVar97 - fVar112;
            fStack_fa0 = fVar43 - fVar114;
            fStack_f9c = fVar46 - fVar115;
            fVar76 = fVar38 - fVar116;
            fVar78 = fVar99 - fVar118;
            fVar80 = fVar44 - fVar119;
            fVar82 = fVar47 - fVar120;
            fVar89 = fVar98 - fVar100;
            fVar92 = fVar113 - fVar101;
            fVar94 = fVar45 - fVar102;
            fVar96 = fVar48 - fVar103;
            auVar52._0_4_ =
                 (fVar76 * (fVar100 + fVar98) - (fVar116 + fVar38) * fVar89) * fVar36 +
                 ((fVar105 + fVar37) * fVar89 - (fVar100 + fVar98) * local_fa8) * fStack_1230 +
                 (local_fa8 * (fVar116 + fVar38) - (fVar105 + fVar37) * fVar76) * fStack_1240;
            auVar52._4_4_ =
                 (fVar78 * (fVar101 + fVar113) - (fVar118 + fVar99) * fVar92) * fVar36 +
                 ((fVar112 + fVar97) * fVar92 - (fVar101 + fVar113) * fStack_fa4) * fStack_1230 +
                 (fStack_fa4 * (fVar118 + fVar99) - (fVar112 + fVar97) * fVar78) * fStack_1240;
            auVar52._8_4_ =
                 (fVar80 * (fVar102 + fVar45) - (fVar119 + fVar44) * fVar94) * fVar36 +
                 ((fVar114 + fVar43) * fVar94 - (fVar102 + fVar45) * fStack_fa0) * fStack_1230 +
                 (fStack_fa0 * (fVar119 + fVar44) - (fVar114 + fVar43) * fVar80) * fStack_1240;
            auVar52._12_4_ =
                 (fVar82 * (fVar103 + fVar48) - (fVar120 + fVar47) * fVar96) * fVar36 +
                 ((fVar115 + fVar46) * fVar96 - (fVar103 + fVar48) * fStack_f9c) * fStack_1230 +
                 (fStack_f9c * (fVar120 + fVar47) - (fVar115 + fVar46) * fVar82) * fStack_1240;
            local_fd8 = local_fb8._0_4_ + fVar111 + auVar52._0_4_;
            fStack_fd4 = local_fb8._4_4_ + fVar104 + auVar52._4_4_;
            fStack_fd0 = local_fb8._8_4_ + local_fc8._8_4_ + auVar52._8_4_;
            fStack_fcc = local_fb8._12_4_ + local_fc8._12_4_ + auVar52._12_4_;
            auVar70._8_4_ = local_fc8._8_4_;
            auVar70._0_8_ = local_fc8._0_8_;
            auVar70._12_4_ = local_fc8._12_4_;
            auVar61 = minps(auVar70,local_fb8);
            auVar61 = minps(auVar61,auVar52);
            auVar106._8_4_ = local_fc8._8_4_;
            auVar106._0_8_ = local_fc8._0_8_;
            auVar106._12_4_ = local_fc8._12_4_;
            auVar107 = maxps(auVar106,local_fb8);
            auVar107 = maxps(auVar107,auVar52);
            fVar115 = ABS(local_fd8) * 1.1920929e-07;
            fVar120 = ABS(fStack_fd4) * 1.1920929e-07;
            fVar103 = ABS(fStack_fd0) * 1.1920929e-07;
            fVar37 = ABS(fStack_fcc) * 1.1920929e-07;
            auVar108._4_4_ = -(uint)(auVar107._4_4_ <= fVar120);
            auVar108._0_4_ = -(uint)(auVar107._0_4_ <= fVar115);
            auVar108._8_4_ = -(uint)(auVar107._8_4_ <= fVar103);
            auVar108._12_4_ = -(uint)(auVar107._12_4_ <= fVar37);
            auVar71._4_4_ = -(uint)(-fVar120 <= auVar61._4_4_);
            auVar71._0_4_ = -(uint)(-fVar115 <= auVar61._0_4_);
            auVar71._8_4_ = -(uint)(-fVar103 <= auVar61._8_4_);
            auVar71._12_4_ = -(uint)(-fVar37 <= auVar61._12_4_);
            auVar108 = auVar108 | auVar71;
            auVar109._0_4_ = auVar108._0_4_ & local_fe8;
            auVar109._4_4_ = auVar108._4_4_ & uStack_fe4;
            auVar109._8_4_ = auVar108._8_4_ & uStack_fe0;
            auVar109._12_4_ = auVar108._12_4_ & uStack_fdc;
            iVar11 = movmskps((int)ray,auVar109);
            if (iVar11 != 0) {
              uVar21 = -(uint)(ABS(fVar75 * fVar76) <= ABS(fVar83 * local_f88));
              uVar23 = -(uint)(ABS(fVar77 * fVar78) <= ABS(fVar84 * fStack_f84));
              uVar27 = -(uint)(ABS(fVar79 * fVar80) <= ABS(fVar85 * fStack_f80));
              uVar30 = -(uint)(ABS(fVar81 * fVar82) <= ABS(fVar86 * fStack_f7c));
              uVar22 = -(uint)(ABS(fVar88 * fVar89) <= ABS(fVar75 * (float)local_11ec._4_4_));
              uVar24 = -(uint)(ABS(fVar91 * fVar92) <= ABS(fVar77 * fStack_11e4));
              uVar28 = -(uint)(ABS(fVar93 * fVar94) <= ABS(fVar79 * (float)uStack_11e0));
              uVar31 = -(uint)(ABS(fVar95 * fVar96) <= ABS(fVar81 * (float)auStack_11dc));
              uVar26 = -(uint)(ABS(fVar83 * local_fa8) <= ABS(fVar88 * local_f98));
              uVar25 = -(uint)(ABS(fVar84 * fStack_fa4) <= ABS(fVar91 * fStack_f94));
              uVar29 = -(uint)(ABS(fVar85 * fStack_fa0) <= ABS(fVar93 * fStack_f90));
              uVar32 = -(uint)(ABS(fVar86 * fStack_f9c) <= ABS(fVar95 * fStack_f8c));
              local_1088[0] =
                   (float)(~uVar21 & (uint)(local_f98 * fVar75 - fVar83 * local_f88) |
                          (uint)(fVar83 * fVar89 - fVar75 * fVar76) & uVar21);
              local_1088[1] =
                   (float)(~uVar23 & (uint)(fStack_f94 * fVar77 - fVar84 * fStack_f84) |
                          (uint)(fVar84 * fVar92 - fVar77 * fVar78) & uVar23);
              local_1088[2] =
                   (float)(~uVar27 & (uint)(fStack_f90 * fVar79 - fVar85 * fStack_f80) |
                          (uint)(fVar85 * fVar94 - fVar79 * fVar80) & uVar27);
              local_1088[3] =
                   (float)(~uVar30 & (uint)(fStack_f8c * fVar81 - fVar86 * fStack_f7c) |
                          (uint)(fVar86 * fVar96 - fVar81 * fVar82) & uVar30);
              local_1078[0] =
                   (float)(~uVar22 & (uint)(local_f88 * fVar88 - fVar75 * (float)local_11ec._4_4_) |
                          (uint)(fVar75 * local_fa8 - fVar88 * fVar89) & uVar22);
              local_1078[1] =
                   (float)(~uVar24 & (uint)(fStack_f84 * fVar91 - fVar77 * fStack_11e4) |
                          (uint)(fVar77 * fStack_fa4 - fVar91 * fVar92) & uVar24);
              local_1078[2] =
                   (float)(~uVar28 & (uint)(fStack_f80 * fVar93 - fVar79 * (float)uStack_11e0) |
                          (uint)(fVar79 * fStack_fa0 - fVar93 * fVar94) & uVar28);
              local_1078[3] =
                   (float)(~uVar31 & (uint)(fStack_f7c * fVar95 - fVar81 * (float)auStack_11dc) |
                          (uint)(fVar81 * fStack_f9c - fVar95 * fVar96) & uVar31);
              local_1068[0] =
                   (float)(~uVar26 & (uint)((float)local_11ec._4_4_ * fVar83 - fVar88 * local_f98) |
                          (uint)(fVar88 * fVar76 - fVar83 * local_fa8) & uVar26);
              local_1068[1] =
                   (float)(~uVar25 & (uint)(fStack_11e4 * fVar84 - fVar91 * fStack_f94) |
                          (uint)(fVar91 * fVar78 - fVar84 * fStack_fa4) & uVar25);
              local_1068[2] =
                   (float)(~uVar29 & (uint)((float)uStack_11e0 * fVar85 - fVar93 * fStack_f90) |
                          (uint)(fVar93 * fVar80 - fVar85 * fStack_fa0) & uVar29);
              local_1068[3] =
                   (float)(~uVar32 & (uint)((float)auStack_11dc * fVar86 - fVar95 * fStack_f8c) |
                          (uint)(fVar95 * fVar82 - fVar86 * fStack_f9c) & uVar32);
              fVar115 = fVar36 * local_1088[0] +
                        fStack_1230 * local_1078[0] + fStack_1240 * local_1068[0];
              fVar120 = fVar36 * local_1088[1] +
                        fStack_1230 * local_1078[1] + fStack_1240 * local_1068[1];
              fVar103 = fVar36 * local_1088[2] +
                        fStack_1230 * local_1078[2] + fStack_1240 * local_1068[2];
              fVar36 = fVar36 * local_1088[3] +
                       fStack_1230 * local_1078[3] + fStack_1240 * local_1068[3];
              auVar33._0_4_ = fVar115 + fVar115;
              auVar33._4_4_ = fVar120 + fVar120;
              auVar33._8_4_ = fVar103 + fVar103;
              auVar33._12_4_ = fVar36 + fVar36;
              auVar53._0_4_ = (float)local_11d8._0_4_ * local_1078[0] + local_11b8 * local_1068[0];
              auVar53._4_4_ = (float)local_11d8._4_4_ * local_1078[1] + fStack_11b4 * local_1068[1];
              auVar53._8_4_ = fStack_11d0 * local_1078[2] + fStack_11b0 * local_1068[2];
              auVar53._12_4_ = fStack_11cc * local_1078[3] + fStack_11ac * local_1068[3];
              fVar115 = fVar87 * local_1088[0] + auVar53._0_4_;
              fVar120 = fVar90 * local_1088[1] + auVar53._4_4_;
              fVar103 = fStack_1200 * local_1088[2] + auVar53._8_4_;
              fVar36 = fStack_11fc * local_1088[3] + auVar53._12_4_;
              auVar72._0_4_ = fVar115 + fVar115;
              auVar72._4_4_ = fVar120 + fVar120;
              auVar72._8_4_ = fVar103 + fVar103;
              auVar72._12_4_ = fVar36 + fVar36;
              auVar61 = rcpps(auVar53,auVar33);
              fVar115 = auVar61._0_4_;
              fVar120 = auVar61._4_4_;
              fVar103 = auVar61._8_4_;
              fVar36 = auVar61._12_4_;
              local_1218 = ((1.0 - auVar33._0_4_ * fVar115) * fVar115 + fVar115) * auVar72._0_4_;
              fStack_1214 = ((1.0 - auVar33._4_4_ * fVar120) * fVar120 + fVar120) * auVar72._4_4_;
              fStack_1210 = ((1.0 - auVar33._8_4_ * fVar103) * fVar103 + fVar103) * auVar72._8_4_;
              fStack_120c = ((1.0 - auVar33._12_4_ * fVar36) * fVar36 + fVar36) * auVar72._12_4_;
              local_11d8._0_4_ = (ray->super_RayK<1>).tfar;
              local_11d8._4_4_ = (ray->super_RayK<1>).mask;
              fStack_11d0 = (float)(ray->super_RayK<1>).id;
              fStack_11cc = (float)(ray->super_RayK<1>).flags;
              fVar115 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar34._0_4_ =
                   (int)((uint)(auVar33._0_4_ != 0.0 &&
                               (local_1218 <= (float)local_11d8._0_4_ && fVar115 <= local_1218)) *
                        -0x80000000) >> 0x1f;
              auVar34._4_4_ =
                   (int)((uint)(auVar33._4_4_ != 0.0 &&
                               (fStack_1214 <= (float)local_11d8._0_4_ && fVar115 <= fStack_1214)) *
                        -0x80000000) >> 0x1f;
              auVar34._8_4_ =
                   (int)((uint)(auVar33._8_4_ != 0.0 &&
                               (fStack_1210 <= (float)local_11d8._0_4_ && fVar115 <= fStack_1210)) *
                        -0x80000000) >> 0x1f;
              auVar34._12_4_ =
                   (int)((uint)(auVar33._12_4_ != 0.0 &&
                               (fStack_120c <= (float)local_11d8._0_4_ && fVar115 <= fStack_120c)) *
                        -0x80000000) >> 0x1f;
              auVar35 = auVar34 & auVar109;
              iVar11 = movmskps((int)ray,auVar35);
              if (iVar11 != 0) {
                local_1108._8_4_ = local_fc8._8_4_;
                local_1108._0_8_ = local_fc8._0_8_;
                fStack_10fc = local_fc8._12_4_;
                local_10f8 = local_fb8._0_4_;
                fStack_10f4 = local_fb8._4_4_;
                fStack_10f0 = local_fb8._8_4_;
                fStack_10ec = local_fb8._12_4_;
                local_10e8._4_4_ = fStack_fd4;
                local_10e8._0_4_ = local_fd8;
                local_10e8._8_4_ = fStack_fd0;
                local_10e8._12_4_ = fStack_fcc;
                local_10d8 = &local_1249;
                local_10c8 = auVar35;
                local_1098[0] = local_1218;
                local_1098[1] = fStack_1214;
                local_1098[2] = fStack_1210;
                local_1098[3] = fStack_120c;
                local_1248 = local_1220->scene;
                local_11c8 = auVar35;
                auVar61 = rcpps(auVar72,local_10e8);
                fVar115 = auVar61._0_4_;
                fVar120 = auVar61._4_4_;
                fVar103 = auVar61._8_4_;
                fVar36 = auVar61._12_4_;
                fVar115 = (float)(-(uint)(1e-18 <= ABS(local_fd8)) &
                                 (uint)(((float)DAT_01f7ba10 - local_fd8 * fVar115) * fVar115 +
                                       fVar115));
                fVar120 = (float)(-(uint)(1e-18 <= ABS(fStack_fd4)) &
                                 (uint)((DAT_01f7ba10._4_4_ - fStack_fd4 * fVar120) * fVar120 +
                                       fVar120));
                fVar103 = (float)(-(uint)(1e-18 <= ABS(fStack_fd0)) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_fd0 * fVar103) * fVar103 +
                                       fVar103));
                fVar36 = (float)(-(uint)(1e-18 <= ABS(fStack_fcc)) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_fcc * fVar36) * fVar36 + fVar36
                                      ));
                auVar110._0_4_ = fVar111 * fVar115;
                auVar110._4_4_ = fVar104 * fVar120;
                auVar110._8_4_ = local_fc8._8_4_ * fVar103;
                auVar110._12_4_ = local_fc8._12_4_ * fVar36;
                local_10b8 = minps(auVar110,_DAT_01f7ba10);
                auVar117._0_4_ = fVar115 * local_fb8._0_4_;
                auVar117._4_4_ = fVar120 * local_fb8._4_4_;
                auVar117._8_4_ = fVar103 * local_fb8._8_4_;
                auVar117._12_4_ = fVar36 * local_fb8._12_4_;
                local_10a8 = minps(auVar117,_DAT_01f7ba10);
                uVar21 = auVar35._0_4_;
                uVar22 = auVar35._4_4_;
                uVar26 = auVar35._8_4_;
                uVar23 = auVar35._12_4_;
                auVar59._0_4_ = uVar21 & (uint)local_1218;
                auVar59._4_4_ = uVar22 & (uint)fStack_1214;
                auVar59._8_4_ = uVar26 & (uint)fStack_1210;
                auVar59._12_4_ = uVar23 & (uint)fStack_120c;
                auVar54._0_8_ = CONCAT44(~uVar22,~uVar21) & 0x7f8000007f800000;
                auVar54._8_4_ = ~uVar26 & 0x7f800000;
                auVar54._12_4_ = ~uVar23 & 0x7f800000;
                auVar54 = auVar54 | auVar59;
                auVar60._4_4_ = auVar54._0_4_;
                auVar60._0_4_ = auVar54._4_4_;
                auVar60._8_4_ = auVar54._12_4_;
                auVar60._12_4_ = auVar54._8_4_;
                auVar61 = minps(auVar60,auVar54);
                auVar66._0_8_ = auVar61._8_8_;
                auVar66._8_4_ = auVar61._0_4_;
                auVar66._12_4_ = auVar61._4_4_;
                auVar61 = minps(auVar66,auVar61);
                auVar67._0_8_ =
                     CONCAT44(-(uint)(auVar61._4_4_ == auVar54._4_4_) & uVar22,
                              -(uint)(auVar61._0_4_ == auVar54._0_4_) & uVar21);
                auVar67._8_4_ = -(uint)(auVar61._8_4_ == auVar54._8_4_) & uVar26;
                auVar67._12_4_ = -(uint)(auVar61._12_4_ == auVar54._12_4_) & uVar23;
                iVar11 = movmskps((int)local_1220,auVar67);
                if (iVar11 != 0) {
                  auVar35._8_4_ = auVar67._8_4_;
                  auVar35._0_8_ = auVar67._0_8_;
                  auVar35._12_4_ = auVar67._12_4_;
                }
                local_1208 = local_1208 + uVar17;
                uVar12 = movmskps(iVar11,auVar35);
                uVar15 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar12);
                pRVar14 = (RayHit *)0x0;
                local_1238._0_4_ = local_11d8._4_4_;
                fStack_123c = fStack_1240;
                fStack_122c = fStack_1230;
                local_1238._4_4_ = fStack_1230;
                if (uVar15 != 0) {
                  for (; (uVar15 >> (long)pRVar14 & 1) == 0;
                      pRVar14 = (RayHit *)((long)(pRVar14->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar21 = *(uint *)(local_1208 + 0x90 + (long)pRVar14 * 4);
                  pGVar8 = (local_1248->geometries).items[uVar21].ptr;
                  if ((pGVar8->mask & (uint)local_1238) == 0) {
                    *(undefined4 *)(local_11c8 + (long)pRVar14 * 4) = 0;
                  }
                  else {
                    _local_11b8 = local_1220->args;
                    if (local_1220->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar16 = local_1220->user;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar115 = *(float *)(local_10b8 + (long)pRVar14 * 4);
                        fVar120 = *(float *)(local_10a8 + (long)pRVar14 * 4);
                        (ray->super_RayK<1>).tfar = local_1098[(long)pRVar14];
                        (ray->Ng).field_0.field_0.x = local_1088[(long)pRVar14];
                        (ray->Ng).field_0.field_0.y = local_1078[(long)pRVar14];
                        (ray->Ng).field_0.field_0.z = local_1068[(long)pRVar14];
                        ray->u = fVar115;
                        ray->v = fVar120;
                        uVar22 = *(uint *)(local_1208 + 0xa0 + (long)pRVar14 * 4);
                        local_1248 = (Scene *)(ulong)uVar22;
                        ray->primID = uVar22;
                        ray->geomID = uVar21;
                        ray->instID[0] = pRVar16->instID[0];
                        ray->instPrimID[0] = pRVar16->instPrimID[0];
                        break;
                      }
                      stack0xffffffffffffee18 = pGVar8;
                    }
                    else {
                      stack0xffffffffffffee18 = pGVar8;
                      pRVar16 = local_1220->user;
                    }
                    local_1158 = local_1088[(long)pRVar14];
                    local_1154 = local_1078[(long)pRVar14];
                    local_1150 = local_1068[(long)pRVar14];
                    local_114c = *(undefined4 *)(local_10b8 + (long)pRVar14 * 4);
                    local_1148 = *(undefined4 *)(local_10a8 + (long)pRVar14 * 4);
                    local_1144 = *(undefined4 *)(local_1208 + 0xa0 + (long)pRVar14 * 4);
                    local_1140 = uVar21;
                    local_113c = pRVar16->instID[0];
                    local_1138 = pRVar16->instPrimID[0];
                    (ray->super_RayK<1>).tfar = local_1098[(long)pRVar14];
                    local_11ec._0_4_ = -NAN;
                    local_11a8.valid = (int *)local_11ec;
                    local_11a8.geometryUserPtr = pGVar8->userPtr;
                    local_11a8.context = pRVar16;
                    local_11a8.ray = (RTCRayN *)ray;
                    local_11a8.hit = (RTCHitN *)&local_1158;
                    local_11a8.N = 1;
                    stack0xffffffffffffee18 = pGVar8;
                    local_1238 = pRVar14;
                    if (((pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar8->intersectionFilterN)(&local_11a8),
                        (((RayK<1> *)local_11a8.valid)->org).field_0.m128[0] != 0.0)) &&
                       ((*(RTCFilterFunctionN *)(_local_11b8 + 0x10) == (RTCFilterFunctionN)0x0 ||
                        ((((*(byte *)_local_11b8 & 2) == 0 &&
                          ((*(byte *)(stack0xffffffffffffee18 + 0x3e) & 0x40) == 0)) ||
                         ((**(RTCFilterFunctionN *)(_local_11b8 + 0x10))(&local_11a8),
                         (((RayK<1> *)local_11a8.valid)->org).field_0.m128[0] != 0.0)))))) {
                      (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11a8.hit;
                      (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11a8.hit + 4);
                      (((Vec3f *)((long)local_11a8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11a8.hit + 8);
                      *(float *)((long)local_11a8.ray + 0x3c) = *(float *)(local_11a8.hit + 0xc);
                      *(float *)((long)local_11a8.ray + 0x40) = *(float *)(local_11a8.hit + 0x10);
                      *(float *)((long)local_11a8.ray + 0x44) = *(float *)(local_11a8.hit + 0x14);
                      *(float *)((long)local_11a8.ray + 0x48) = *(float *)(local_11a8.hit + 0x18);
                      *(float *)((long)local_11a8.ray + 0x4c) = *(float *)(local_11a8.hit + 0x1c);
                      *(float *)((long)local_11a8.ray + 0x50) = *(float *)(local_11a8.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_11d8._0_4_;
                    }
                    *(undefined4 *)(local_11c8 + (long)local_1238 * 4) = 0;
                    local_11d8._0_4_ = (ray->super_RayK<1>).tfar;
                    local_11d8._4_4_ = (ray->super_RayK<1>).mask;
                    fStack_11d0 = (float)(ray->super_RayK<1>).id;
                    fStack_11cc = (float)(ray->super_RayK<1>).flags;
                    local_11c8._0_4_ =
                         -(uint)(local_1218 <= (float)local_11d8._0_4_) & local_11c8._0_4_;
                    local_11c8._4_4_ =
                         -(uint)(fStack_1214 <= (float)local_11d8._0_4_) & local_11c8._4_4_;
                    local_11c8._8_4_ =
                         -(uint)(fStack_1210 <= (float)local_11d8._0_4_) & local_11c8._8_4_;
                    local_11c8._12_4_ =
                         -(uint)(fStack_120c <= (float)local_11d8._0_4_) & local_11c8._12_4_;
                    local_1238._0_4_ = (ray->super_RayK<1>).mask;
                    pRVar14 = ray;
                  }
                  iVar11 = movmskps((int)pRVar14,local_11c8);
                  if (iVar11 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  pRVar14 = (RayHit *)local_11a8.valid;
                } while( true );
              }
            }
            local_1228 = local_1228 + 1;
          } while (local_1228 != local_1160);
        }
        fVar115 = (ray->super_RayK<1>).tfar;
        auVar107._4_4_ = fVar115;
        auVar107._0_4_ = fVar115;
        auVar107._8_4_ = fVar115;
        auVar107._12_4_ = fVar115;
        fVar75 = local_ff8;
        fVar76 = fStack_ff4;
        fVar77 = fStack_ff0;
        fVar37 = fStack_fec;
        auVar61 = local_1018;
        fVar98 = local_1178;
        fVar115 = fStack_1174;
        fVar120 = fStack_1170;
        fVar38 = fStack_116c;
        fVar111 = local_1118;
        fVar43 = fStack_1114;
        fVar44 = fStack_1110;
        fVar45 = fStack_110c;
        fVar97 = local_1128;
        fVar46 = fStack_1124;
        fVar47 = fStack_1120;
        fVar48 = fStack_111c;
        fVar78 = local_1008;
        fVar79 = fStack_1004;
        fVar80 = fStack_1000;
        fVar99 = fStack_ffc;
        fVar81 = local_1028;
        fVar82 = fStack_1024;
        fVar83 = fStack_1020;
        fVar113 = fStack_101c;
        fVar84 = local_1038;
        fVar85 = fStack_1034;
        fVar86 = fStack_1030;
        fVar103 = fStack_102c;
        fVar87 = local_1048;
        fVar88 = fStack_1044;
        fVar89 = fStack_1040;
        fVar36 = fStack_103c;
        fVar90 = local_1058;
        fVar91 = fStack_1054;
        fVar92 = fStack_1050;
        fVar104 = fStack_104c;
      }
    } while (pauVar13 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }